

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall FormatterTest_NumericAlign_Test::TestBody(FormatterTest_NumericAlign_Test *this)

{
  AssertHelperData *pAVar1;
  bool bVar2;
  char *pcVar3;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_string_view<char> format_str_13;
  basic_string_view<char> format_str_14;
  basic_string_view<char> format_str_15;
  basic_string_view<char> format_str_16;
  basic_string_view<char> format_str_17;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_07;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_08;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_09;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_10;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_11;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_12;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_13;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_14;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_15;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_16;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_17;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_18;
  undefined1 local_358 [32];
  undefined8 local_338;
  _Alloc_hider local_330;
  AssertionResult local_328;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_310;
  undefined1 *local_308;
  long local_300;
  undefined8 local_2f8;
  undefined1 local_2f0 [504];
  internal local_f8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined8 local_68 [2];
  undefined8 local_58 [2];
  char *local_48 [3];
  
  local_328.success_ = true;
  local_328._1_7_ = 0;
  local_300 = 0;
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2f8 = 500;
  format_str.size_ = 6;
  format_str.data_ = "{0:=4}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_328;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
                ::TYPES;
  local_308 = local_2f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_310,format_str,args,(locale_ref)0x0);
  pAVar1 = (AssertHelperData *)(local_358 + 0x10);
  local_358._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,local_308,local_308 + local_300);
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_308 != local_2f0) {
    operator_delete(local_308);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_338,"\"  42\"","format(\"{0:=4}\", 42)",(char (*) [5])0x242e5d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if (local_338._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_310);
    if (local_330._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_330._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x377,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
    if (((local_310.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_310.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_328.success_ = true;
  local_328._1_7_ = 0;
  local_300 = 0;
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2f8 = 500;
  format_str_00.size_ = 7;
  format_str_00.data_ = "{0:=+4}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_328;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_308 = local_2f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_310,format_str_00,args_00,(locale_ref)0x0);
  local_358._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,local_308,local_308 + local_300);
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_308 != local_2f0) {
    operator_delete(local_308);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_338,"\"+ 42\"","format(\"{0:=+4}\", 42)",(char (*) [5])"+ 42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if (local_338._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_310);
    if (local_330._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_330._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x378,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
    if (((local_310.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_310.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_328.success_ = true;
  local_328._1_7_ = 0;
  local_300 = 0;
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2f8 = 500;
  format_str_01.size_ = 7;
  format_str_01.data_ = "{0:=4o}";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_328;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_308 = local_2f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_310,format_str_01,args_01,(locale_ref)0x0);
  local_358._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,local_308,local_308 + local_300);
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_308 != local_2f0) {
    operator_delete(local_308);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_338,"\"  42\"","format(\"{0:=4o}\", 042)",(char (*) [5])0x242e5d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if (local_338._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_310);
    if (local_330._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_330._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x379,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
    if (((local_310.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_310.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_328.success_ = true;
  local_328._1_7_ = 0;
  local_300 = 0;
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2f8 = 500;
  format_str_02.size_ = 8;
  format_str_02.data_ = "{0:=+4o}";
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_328;
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_308 = local_2f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_310,format_str_02,args_02,(locale_ref)0x0);
  local_358._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,local_308,local_308 + local_300);
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_308 != local_2f0) {
    operator_delete(local_308);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_338,"\"+ 42\"","format(\"{0:=+4o}\", 042)",(char (*) [5])"+ 42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if (local_338._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_310);
    if (local_330._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_330._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x37a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
    if (((local_310.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_310.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_328.success_ = true;
  local_328._1_7_ = 0;
  local_300 = 0;
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2f8 = 500;
  format_str_03.size_ = 7;
  format_str_03.data_ = "{0:=4x}";
  args_03.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_328;
  args_03.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_308 = local_2f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_310,format_str_03,args_03,(locale_ref)0x0);
  local_358._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,local_308,local_308 + local_300);
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_308 != local_2f0) {
    operator_delete(local_308);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_338,"\"  42\"","format(\"{0:=4x}\", 0x42)",(char (*) [5])0x242e5d,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if (local_338._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_310);
    if (local_330._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_330._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x37b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
    if (((local_310.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_310.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_328.success_ = true;
  local_328._1_7_ = 0;
  local_300 = 0;
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2f8 = 500;
  format_str_04.size_ = 8;
  format_str_04.data_ = "{0:=+4x}";
  args_04.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_328;
  args_04.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_308 = local_2f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_310,format_str_04,args_04,(locale_ref)0x0);
  local_358._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,local_308,local_308 + local_300);
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_308 != local_2f0) {
    operator_delete(local_308);
  }
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&local_338,"\"+ 42\"","format(\"{0:=+4x}\", 0x42)",(char (*) [5])"+ 42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if (local_338._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_310);
    if (local_330._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_330._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x37c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
    if (((local_310.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_310.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_328.success_ = true;
  local_328._1_7_ = 0xffffff;
  local_300 = 0;
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2f8 = 500;
  format_str_05.size_ = 6;
  format_str_05.data_ = "{0:=5}";
  args_05.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_328;
  args_05.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_308 = local_2f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_310,format_str_05,args_05,(locale_ref)0x0);
  local_358._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,local_308,local_308 + local_300);
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_308 != local_2f0) {
    operator_delete(local_308);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_338,"\"-  42\"","format(\"{0:=5}\", -42)",(char (*) [6])"-  42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if (local_338._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_310);
    if (local_330._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_330._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x37d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
    if (((local_310.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_310.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_328.success_ = true;
  local_328._1_7_ = 0;
  local_300 = 0;
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2f8 = 500;
  format_str_06.size_ = 6;
  format_str_06.data_ = "{0:=5}";
  args_06.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_328;
  args_06.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
       ::TYPES;
  local_308 = local_2f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_310,format_str_06,args_06,(locale_ref)0x0);
  local_358._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,local_308,local_308 + local_300);
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_308 != local_2f0) {
    operator_delete(local_308);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_338,"\"   42\"","format(\"{0:=5}\", 42u)",(char (*) [6])0x242e5c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if (local_338._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_310);
    if (local_330._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_330._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x37e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
    if (((local_310.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_310.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_328.success_ = true;
  local_328._1_7_ = 0xffffffffffffff;
  local_300 = 0;
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2f8 = 500;
  format_str_07.size_ = 6;
  format_str_07.data_ = "{0:=5}";
  args_07.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_328;
  args_07.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long>
       ::TYPES;
  local_308 = local_2f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_310,format_str_07,args_07,(locale_ref)0x0);
  local_358._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,local_308,local_308 + local_300);
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_308 != local_2f0) {
    operator_delete(local_308);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_338,"\"-  42\"","format(\"{0:=5}\", -42l)",(char (*) [6])"-  42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if (local_338._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_310);
    if (local_330._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_330._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x37f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
    if (((local_310.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_310.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_328.success_ = true;
  local_328._1_7_ = 0;
  local_300 = 0;
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2f8 = 500;
  format_str_08.size_ = 6;
  format_str_08.data_ = "{0:=5}";
  args_08.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_328;
  args_08.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long>
       ::TYPES;
  local_308 = local_2f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_310,format_str_08,args_08,(locale_ref)0x0);
  local_358._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,local_308,local_308 + local_300);
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_308 != local_2f0) {
    operator_delete(local_308);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_338,"\"   42\"","format(\"{0:=5}\", 42ul)",(char (*) [6])0x242e5c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if (local_338._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_310);
    if (local_330._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_330._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x380,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
    if (((local_310.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_310.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_328.success_ = true;
  local_328._1_7_ = 0xffffffffffffff;
  local_300 = 0;
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2f8 = 500;
  format_str_09.size_ = 6;
  format_str_09.data_ = "{0:=5}";
  args_09.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_328;
  args_09.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_long>
       ::TYPES;
  local_308 = local_2f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_310,format_str_09,args_09,(locale_ref)0x0);
  local_358._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,local_308,local_308 + local_300);
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_308 != local_2f0) {
    operator_delete(local_308);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_338,"\"-  42\"","format(\"{0:=5}\", -42ll)",(char (*) [6])"-  42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if (local_338._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_310);
    if (local_330._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_330._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x381,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
    if (((local_310.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_310.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_328.success_ = true;
  local_328._1_7_ = 0;
  local_300 = 0;
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2f8 = 500;
  format_str_10.size_ = 6;
  format_str_10.data_ = "{0:=5}";
  args_10.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_328;
  args_10.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long_long>
       ::TYPES;
  local_308 = local_2f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_310,format_str_10,args_10,(locale_ref)0x0);
  local_358._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,local_308,local_308 + local_300);
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_308 != local_2f0) {
    operator_delete(local_308);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_338,"\"   42\"","format(\"{0:=5}\", 42ull)",(char (*) [6])0x242e5c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if (local_338._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_310);
    if (local_330._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_330._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x382,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
    if (((local_310.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_310.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_328.success_ = false;
  local_328._1_7_ = 0xc0450000000000;
  local_300 = 0;
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2f8 = 500;
  format_str_11.size_ = 6;
  format_str_11.data_ = "{0:=5}";
  args_11.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_328;
  args_11.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,double>
       ::TYPES;
  local_308 = local_2f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_310,format_str_11,args_11,(locale_ref)0x0);
  local_358._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,local_308,local_308 + local_300);
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_308 != local_2f0) {
    operator_delete(local_308);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_338,"\"-  42\"","format(\"{0:=5}\", -42.0)",(char (*) [6])"-  42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if (local_338._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_310);
    if (local_330._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_330._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,899,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
    if (((local_310.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_310.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_328.success_ = false;
  local_328._1_7_ = 0xa8000000000000;
  local_328.message_.ptr_._0_2_ = 0xc004;
  local_300 = 0;
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2f8 = 500;
  format_str_12.size_ = 6;
  format_str_12.data_ = "{0:=5}";
  args_12.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_328;
  args_12.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_double>
       ::TYPES;
  local_308 = local_2f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_310,format_str_12,args_12,(locale_ref)0x0);
  local_358._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,local_308,local_308 + local_300);
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_308 != local_2f0) {
    operator_delete(local_308);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_338,"\"-  42\"","format(\"{0:=5}\", -42.0l)",(char (*) [6])"-  42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if (local_338._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_310);
    if (local_330._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_330._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,900,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
    if (((local_310.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_310.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_328.success_ == true) {
    local_358._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"missing \'}\' in format string","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_68[0] = 99;
      local_300 = 0;
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_2f8 = 500;
      format_str_13.size_ = 5;
      format_str_13.data_ = "{0:=5";
      args_13.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_68;
      args_13.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char>
           ::TYPES;
      local_308 = local_2f0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_310,format_str_13,args_13,(locale_ref)0x0);
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_88,local_308,local_308 + local_300);
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_308 != local_2f0) {
        operator_delete(local_308);
      }
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_328,
               (char (*) [102])
               "Expected: format(\"{0:=5\", \'c\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
      operator_delete((void *)local_358._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_310);
  if ((undefined8 *)CONCAT62(local_328.message_.ptr_._2_6_,local_328.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_328.message_.ptr_._2_6_,local_328.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_358,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x386,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
  if (((local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_310.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_310.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_328.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_328.success_ == true) {
    local_358._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"invalid format specifier for char","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_58[0] = 99;
      local_300 = 0;
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_2f8 = 500;
      format_str_14.size_ = 6;
      format_str_14.data_ = "{0:=5}";
      args_14.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_58;
      args_14.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char>
           ::TYPES;
      local_308 = local_2f0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_310,format_str_14,args_14,(locale_ref)0x0);
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a8,local_308,local_308 + local_300);
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_308 != local_2f0) {
        operator_delete(local_308);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_328,
               (char (*) [103])
               "Expected: format(\"{0:=5}\", \'c\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
      operator_delete((void *)local_358._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_310);
  if ((undefined8 *)CONCAT62(local_328.message_.ptr_._2_6_,local_328.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_328.message_.ptr_._2_6_,local_328.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_358,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x388,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
  if (((local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_310.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_310.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_328.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_328.success_ == true) {
    local_358._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"format specifier requires numeric argument","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_48[0] = "abc";
      local_300 = 0;
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_2f8 = 500;
      format_str_15.size_ = 6;
      format_str_15.data_ = "{0:=5}";
      args_15.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_48;
      args_15.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char[4]>
           ::TYPES;
      local_308 = local_2f0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_310,format_str_15,args_15,(locale_ref)0x0);
      local_c8[0] = local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,local_308,local_308 + local_300);
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_308 != local_2f0) {
        operator_delete(local_308);
      }
      if (local_c8[0] != local_b8) {
        operator_delete(local_c8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_328,
               (char (*) [105])
               "Expected: format(\"{0:=5}\", \"abc\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
      operator_delete((void *)local_358._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_310);
  if ((undefined8 *)CONCAT62(local_328.message_.ptr_._2_6_,local_328.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_328.message_.ptr_._2_6_,local_328.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_358,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x38a,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
  if (((local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_310.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_310.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_328.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_328.success_ == true) {
    local_358._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"format specifier requires numeric argument","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_338 = 0xface;
      local_300 = 0;
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_2f8 = 500;
      format_str_16.size_ = 6;
      format_str_16.data_ = "{0:=8}";
      args_16.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_338;
      args_16.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*>
           ::TYPES;
      local_308 = local_2f0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_310,format_str_16,args_16,(locale_ref)0x0);
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,local_308,local_308 + local_300);
      local_310.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_308 != local_2f0) {
        operator_delete(local_308);
      }
      if (local_e8[0] != local_d8) {
        operator_delete(local_e8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_328,
               (char (*) [131])
               "Expected: format(\"{0:=8}\", reinterpret_cast<void*>(0xface)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
      operator_delete((void *)local_358._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_310);
  if ((undefined8 *)CONCAT62(local_328.message_.ptr_._2_6_,local_328.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_328.message_.ptr_._2_6_,local_328.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_358,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x38c,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
  if (((local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_310.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_310.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_328.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_328.success_ = false;
  local_328._1_7_ = 0x3ff00000000000;
  local_300 = 0;
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2f8 = 500;
  format_str_17.size_ = 5;
  format_str_17.data_ = "{:= }";
  args_17.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_328;
  args_17.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,double>
       ::TYPES;
  local_308 = local_2f0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_310,format_str_17,args_17,(locale_ref)0x0);
  local_358._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_358,local_308,local_308 + local_300);
  local_310.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_308 != local_2f0) {
    operator_delete(local_308);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_f8,"\" 1\"","fmt::format(\"{:= }\", 1.0)",(char (*) [3])0x24461b,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
  if ((AssertHelperData *)local_358._0_8_ != pAVar1) {
    operator_delete((void *)local_358._0_8_);
  }
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_310);
    if (local_f0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_f0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x38d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
    if (((local_310.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_310.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_310.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatterTest, NumericAlign) {
  EXPECT_EQ("  42", format("{0:=4}", 42));
  EXPECT_EQ("+ 42", format("{0:=+4}", 42));
  EXPECT_EQ("  42", format("{0:=4o}", 042));
  EXPECT_EQ("+ 42", format("{0:=+4o}", 042));
  EXPECT_EQ("  42", format("{0:=4x}", 0x42));
  EXPECT_EQ("+ 42", format("{0:=+4x}", 0x42));
  EXPECT_EQ("-  42", format("{0:=5}", -42));
  EXPECT_EQ("   42", format("{0:=5}", 42u));
  EXPECT_EQ("-  42", format("{0:=5}", -42l));
  EXPECT_EQ("   42", format("{0:=5}", 42ul));
  EXPECT_EQ("-  42", format("{0:=5}", -42ll));
  EXPECT_EQ("   42", format("{0:=5}", 42ull));
  EXPECT_EQ("-  42", format("{0:=5}", -42.0));
  EXPECT_EQ("-  42", format("{0:=5}", -42.0l));
  EXPECT_THROW_MSG(format("{0:=5", 'c'),
      format_error, "missing '}' in format string");
  EXPECT_THROW_MSG(format("{0:=5}", 'c'),
      format_error, "invalid format specifier for char");
  EXPECT_THROW_MSG(format("{0:=5}", "abc"),
      format_error, "format specifier requires numeric argument");
  EXPECT_THROW_MSG(format("{0:=8}", reinterpret_cast<void*>(0xface)),
      format_error, "format specifier requires numeric argument");
  EXPECT_EQ(" 1", fmt::format("{:= }", 1.0));
}